

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

int __thiscall ON_String::Find(ON_String *this,char utf8_single_byte_c)

{
  int iVar1;
  char local_1b [3];
  char s [2];
  ON_String *pOStack_18;
  char utf8_single_byte_c_local;
  ON_String *this_local;
  
  local_1b[2] = utf8_single_byte_c;
  pOStack_18 = this;
  iVar1 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c);
  if (iVar1 == 0) {
    this_local._4_4_ = -1;
  }
  else {
    local_1b[0] = local_1b[2];
    local_1b[1] = 0;
    this_local._4_4_ = Find(this,local_1b);
  }
  return this_local._4_4_;
}

Assistant:

int ON_String::Find(char utf8_single_byte_c) const
{
	// find first single character
  if (ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c))
  {
    char s[2];
    s[0] = utf8_single_byte_c;
    s[1] = 0;
    return Find(s);
  }
  return -1;
}